

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderLoader.cpp
# Opt level: O0

void __thiscall
Assimp::BlenderImporter::ParseBlendFile
          (BlenderImporter *this,FileDatabase *out,shared_ptr<Assimp::IOStream> *stream)

{
  bool bVar1;
  StreamReader<true,_true> *this_00;
  element_type *stream_00;
  iterator __first;
  iterator __last;
  allocator<char> local_e1;
  string local_e0;
  FileBlockHead *local_c0;
  FileBlockHead *head;
  SectionParser parser;
  DNA *dna;
  DNAParser dna_reader;
  shared_ptr<Assimp::IOStream> local_40;
  shared_ptr<Assimp::StreamReader<true,_true>_> local_30;
  shared_ptr<Assimp::IOStream> *local_20;
  shared_ptr<Assimp::IOStream> *stream_local;
  FileDatabase *out_local;
  BlenderImporter *this_local;
  
  local_20 = stream;
  stream_local = (shared_ptr<Assimp::IOStream> *)out;
  out_local = (FileDatabase *)this;
  this_00 = (StreamReader<true,_true> *)operator_new(0x38);
  dna_reader.db._3_1_ = 1;
  std::shared_ptr<Assimp::IOStream>::shared_ptr(&local_40,stream);
  StreamReader<true,_true>::StreamReader
            (this_00,&local_40,
             (bool)(*(byte *)((long)&(stream_local->
                                     super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>
                                     )._M_ptr + 1) & 1));
  dna_reader.db._3_1_ = 0;
  std::shared_ptr<Assimp::StreamReader<true,true>>::shared_ptr<Assimp::StreamReader<true,true>,void>
            ((shared_ptr<Assimp::StreamReader<true,true>> *)&local_30,this_00);
  std::shared_ptr<Assimp::StreamReader<true,_true>_>::operator=
            ((shared_ptr<Assimp::StreamReader<true,_true>_> *)(stream_local + 8),&local_30);
  std::shared_ptr<Assimp::StreamReader<true,_true>_>::~shared_ptr(&local_30);
  std::shared_ptr<Assimp::IOStream>::~shared_ptr(&local_40);
  Blender::DNAParser::DNAParser((DNAParser *)&dna,(FileDatabase *)stream_local);
  parser.ptr64 = false;
  parser._81_7_ = 0;
  std::vector<Assimp::Blender::FileBlockHead,_std::allocator<Assimp::Blender::FileBlockHead>_>::
  reserve((vector<Assimp::Blender::FileBlockHead,_std::allocator<Assimp::Blender::FileBlockHead>_> *
          )(stream_local + 9),0x80);
  stream_00 = std::__shared_ptr<Assimp::StreamReader<true,_true>,_(__gnu_cxx::_Lock_policy)2>::get
                        ((__shared_ptr<Assimp::StreamReader<true,_true>,_(__gnu_cxx::_Lock_policy)2>
                          *)(stream_local + 8));
  Blender::SectionParser::SectionParser
            ((SectionParser *)&head,stream_00,
             (bool)(*(byte *)&(stream_local->
                              super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>).
                              _M_ptr & 1));
  while( true ) {
    Blender::SectionParser::Next((SectionParser *)&head);
    local_c0 = Blender::SectionParser::GetCurrent((SectionParser *)&head);
    bVar1 = std::operator==(&local_c0->id,"ENDB");
    if (bVar1) break;
    bVar1 = std::operator==(&local_c0->id,"DNA1");
    if (bVar1) {
      Blender::DNAParser::Parse((DNAParser *)&dna);
      parser._80_8_ = Blender::DNAParser::GetDNA((DNAParser *)&dna);
    }
    else {
      std::vector<Assimp::Blender::FileBlockHead,_std::allocator<Assimp::Blender::FileBlockHead>_>::
      push_back((vector<Assimp::Blender::FileBlockHead,_std::allocator<Assimp::Blender::FileBlockHead>_>
                 *)(stream_local + 9),local_c0);
    }
  }
  Blender::SectionParser::~SectionParser((SectionParser *)&head);
  if (parser._80_8_ == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e0,"SDNA not found",&local_e1);
    LogFunctions<Assimp::BlenderImporter>::ThrowException(&local_e0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::allocator<char>::~allocator(&local_e1);
  }
  __first = std::
            vector<Assimp::Blender::FileBlockHead,_std::allocator<Assimp::Blender::FileBlockHead>_>
            ::begin((vector<Assimp::Blender::FileBlockHead,_std::allocator<Assimp::Blender::FileBlockHead>_>
                     *)(stream_local + 9));
  __last = std::
           vector<Assimp::Blender::FileBlockHead,_std::allocator<Assimp::Blender::FileBlockHead>_>::
           end((vector<Assimp::Blender::FileBlockHead,_std::allocator<Assimp::Blender::FileBlockHead>_>
                *)(stream_local + 9));
  std::
  sort<__gnu_cxx::__normal_iterator<Assimp::Blender::FileBlockHead*,std::vector<Assimp::Blender::FileBlockHead,std::allocator<Assimp::Blender::FileBlockHead>>>>
            ((__normal_iterator<Assimp::Blender::FileBlockHead_*,_std::vector<Assimp::Blender::FileBlockHead,_std::allocator<Assimp::Blender::FileBlockHead>_>_>
              )__first._M_current,
             (__normal_iterator<Assimp::Blender::FileBlockHead_*,_std::vector<Assimp::Blender::FileBlockHead,_std::allocator<Assimp::Blender::FileBlockHead>_>_>
              )__last._M_current);
  return;
}

Assistant:

void BlenderImporter::ParseBlendFile(FileDatabase& out, std::shared_ptr<IOStream> stream)
{
    out.reader = std::shared_ptr<StreamReaderAny>(new StreamReaderAny(stream,out.little));

    DNAParser dna_reader(out);
    const DNA* dna = NULL;

    out.entries.reserve(128); { // even small BLEND files tend to consist of many file blocks
        SectionParser parser(*out.reader.get(),out.i64bit);

        // first parse the file in search for the DNA and insert all other sections into the database
        while ((parser.Next(),1)) {
            const FileBlockHead& head = parser.GetCurrent();

            if (head.id == "ENDB") {
                break; // only valid end of the file
            }
            else if (head.id == "DNA1") {
                dna_reader.Parse();
                dna = &dna_reader.GetDNA();
                continue;
            }

            out.entries.push_back(head);
        }
    }
    if (!dna) {
        ThrowException("SDNA not found");
    }

    std::sort(out.entries.begin(),out.entries.end());
}